

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

void __thiscall CTcParser::finish_local_ctx(CTcParser *this,CTPNCodeBody *cb,CTcPrsSymtab *param_2)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  CTcPrsSymtab *pCVar4;
  enum_locals_ctx ctx;
  CTcPrsSymtab *local_10;
  CTPNCodeBody *local_8;
  
  if ((this->field_0x1e8 & 1) != 0) {
    iVar2 = this->local_ctx_var_num_;
    iVar3 = this->next_ctx_arr_idx_;
    puVar1 = &(cb->super_CTPNCodeBodyBase).field_0xb8;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 8;
    (cb->super_CTPNCodeBodyBase).local_ctx_var_ = iVar2;
    (cb->super_CTPNCodeBodyBase).local_ctx_arr_size_ = iVar3 + -1;
  }
  if (param_2 != (CTcPrsSymtab *)0x0) {
    pCVar4 = this->local_symtab_;
    do {
      local_10 = pCVar4;
      pCVar4 = local_10->parent_;
      if (pCVar4 == (CTcPrsSymtab *)0x0) break;
    } while (pCVar4 != this->global_symtab_);
    local_8 = cb;
    CTcPrsSymtab::enum_entries(local_10,enum_for_ctx_locals,&local_10);
  }
  return;
}

Assistant:

void CTcParser::finish_local_ctx(CTPNCodeBody *cb, CTcPrsSymtab *local_symtab)
{
    /* if we have a local context, mark the code body accordingly */
    if (has_local_ctx_)
        cb->set_local_ctx(local_ctx_var_num_, next_ctx_arr_idx_ - 1);

    /* 
     *   If the caller passed in a local symbol table, check the table for
     *   context variables from enclosing scopes, and assign the local holder
     *   for each such variable. 
     */
    if (local_symtab != 0)
    {
        /* 
         *   consider only the outermost local table, since that's where the
         *   shared locals reside 
         */
        CTcPrsSymtab *tab, *par;
        for (tab = local_symtab_, par = tab->get_parent() ;
             par != 0 && par != global_symtab_ ;
             tab = par, par = par->get_parent()) ;

        /* enumerate the variables */
        enum_locals_ctx ctx;
        ctx.symtab = tab;
        ctx.code_body = cb;
        tab->enum_entries(&enum_for_ctx_locals, &ctx);
    }
}